

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_twod_analytic_node(REF_NODE ref_node,char *version)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_238;
  double local_218;
  double local_200;
  double local_1e8;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_DBL m22_1;
  REF_DBL m11_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL m22;
  REF_DBL m11;
  REF_DBL c2;
  REF_DBL c1;
  REF_BOOL metric_recognized;
  REF_DBL m [6];
  REF_DBL d [12];
  REF_DBL d0;
  REF_DBL k1;
  REF_DBL c;
  REF_DBL hx;
  REF_DBL hy;
  REF_DBL hh;
  REF_DBL h;
  REF_DBL h0;
  REF_DBL h_r;
  REF_DBL h_t;
  REF_DBL h_z;
  REF_DBL t;
  REF_DBL r;
  REF_DBL y;
  REF_DBL x;
  REF_INT node;
  char *version_local;
  REF_NODE ref_node_local;
  
  y = 0.0;
  r = 0.0;
  h0 = 1.0;
  bVar1 = false;
  x._4_4_ = 0;
  do {
    if (ref_node->max <= x._4_4_) {
      if (!bVar1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x110,"ref_metric_twod_analytic_node","metric unknown");
      }
      ref_node_local._4_4_ = (uint)!bVar1;
      return ref_node_local._4_4_;
    }
    if (((-1 < x._4_4_) && (x._4_4_ < ref_node->max)) && (-1 < ref_node->global[x._4_4_])) {
      iVar2 = strcmp(version,"larsson1");
      if (iVar2 == 0) {
        bVar1 = true;
        y = ref_node->real[x._4_4_ * 0xf];
        r = ref_node->real[x._4_4_ * 0xf + 1];
        dVar4 = sin(y * 6.28318530717958);
        dVar5 = sin(r * 6.28318530717958);
        dVar6 = sin(y * 6.28318530717958);
        dVar7 = sin(r * 6.28318530717958);
        uVar3 = ref_node_metric_form
                          (ref_node,x._4_4_,dVar4 * 200.0 * dVar5 + 400.0,0.0,0.0,
                           -(dVar6 * 200.0) * dVar7 + 400.0,0.0,1.0);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x94,"ref_metric_twod_analytic_node",(ulong)uVar3,"set node met");
          return uVar3;
        }
      }
      else {
        iVar2 = strcmp(version,"larsson2");
        if (iVar2 == 0) {
          bVar1 = true;
          y = ref_node->real[x._4_4_ * 0xf];
          r = ref_node->real[x._4_4_ * 0xf + 1];
          dVar4 = pow(r * 0.05 + 0.05,-2.0);
          dVar5 = pow(r * 0.12 + 0.04,-2.0);
          uVar3 = ref_node_metric_form(ref_node,x._4_4_,dVar4,0.0,0.0,dVar5,0.0,1.0);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xa0,"ref_metric_twod_analytic_node",(ulong)uVar3,"set node met");
            return uVar3;
          }
        }
        else {
          iVar2 = strcmp(version,"iso01");
          if (iVar2 == 0) {
            bVar1 = true;
            uVar3 = ref_node_metric_form
                              (ref_node,x._4_4_,99.99999999999999,0.0,0.0,99.99999999999999,0.0,1.0)
            ;
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xa8,"ref_metric_twod_analytic_node",(ulong)uVar3,"set node met");
              return uVar3;
            }
          }
          else {
            iVar2 = strcmp(version,"isorad");
            if (iVar2 == 0) {
              bVar1 = true;
              dVar4 = pow(ref_node->real[x._4_4_ * 0xf],2.0);
              dVar5 = pow(ref_node->real[x._4_4_ * 0xf + 1],2.0);
              dVar6 = pow(ref_node->real[x._4_4_ * 0xf + 2],2.0);
              dVar4 = sqrt(dVar4 + dVar5 + dVar6);
              dVar4 = dVar4 * 0.1 + 0.1;
              uVar3 = ref_node_metric_form
                                (ref_node,x._4_4_,1.0 / (dVar4 * dVar4),0.0,0.0,
                                 1.0 / (dVar4 * dVar4),0.0,1.0);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0xb3,"ref_metric_twod_analytic_node",(ulong)uVar3,"set node met");
                return uVar3;
              }
            }
            else {
              iVar2 = strcmp(version,"masabl-1");
              if (iVar2 == 0) {
                bVar1 = true;
                dVar4 = cos((ref_node->real[x._4_4_ * 0xf] - 0.5) * 3.14159265358979);
                dVar4 = dVar4 * 0.2 + 0.01;
                dVar5 = exp(ref_node->real[x._4_4_ * 0xf + 1] * 6.0);
                uVar3 = ref_node_metric_form
                                  (ref_node,x._4_4_,1.0 / (dVar4 * dVar4),0.0,0.0,
                                   1.0 / (dVar5 * 0.001 * dVar5 * 0.001),0.0,1.0);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0xbf,"ref_metric_twod_analytic_node",(ulong)uVar3,"set node met");
                  return uVar3;
                }
              }
              else {
                iVar2 = strcmp(version,"side");
                if (iVar2 == 0) {
                  bVar1 = true;
                  dVar4 = ref_node->real[x._4_4_ * 0xf + 1] * 0.09000000000000001 + 0.01;
                  uVar3 = ref_node_metric_form
                                    (ref_node,x._4_4_,99.99999999999999,0.0,0.0,
                                     1.0 / (dVar4 * dVar4),0.0,1.0);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0xc9,"ref_metric_twod_analytic_node",(ulong)uVar3,"set node met");
                    return uVar3;
                  }
                }
                else {
                  iVar2 = strcmp(version,"linear-0001");
                  if (iVar2 == 0) {
                    bVar1 = true;
                    if (ref_node->real[x._4_4_ * 0xf + 1] - 0.5 <= 0.0) {
                      local_1e8 = -(ref_node->real[x._4_4_ * 0xf + 1] - 0.5);
                    }
                    else {
                      local_1e8 = ref_node->real[x._4_4_ * 0xf + 1] - 0.5;
                    }
                    dVar4 = (local_1e8 * 0.0999) / 0.5 + 0.0001;
                    uVar3 = ref_node_metric_form
                                      (ref_node,x._4_4_,99.99999999999999,0.0,0.0,
                                       1.0 / (dVar4 * dVar4),0.0,1.0);
                    if (uVar3 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0xd3,"ref_metric_twod_analytic_node",(ulong)uVar3,"set node met");
                      return uVar3;
                    }
                  }
                  else {
                    iVar2 = strcmp(version,"linear-01");
                    if (iVar2 == 0) {
                      bVar1 = true;
                      if (ref_node->real[x._4_4_ * 0xf + 1] - 0.5 <= 0.0) {
                        local_200 = -(ref_node->real[x._4_4_ * 0xf + 1] - 0.5);
                      }
                      else {
                        local_200 = ref_node->real[x._4_4_ * 0xf + 1] - 0.5;
                      }
                      dVar4 = (local_200 * 0.09000000000000001) / 0.5 + 0.01;
                      uVar3 = ref_node_metric_form
                                        (ref_node,x._4_4_,99.99999999999999,0.0,0.0,
                                         1.0 / (dVar4 * dVar4),0.0,1.0);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0xdd,"ref_metric_twod_analytic_node",(ulong)uVar3,"set node met");
                        return uVar3;
                      }
                    }
                    else {
                      iVar2 = strcmp(version,"polar-2");
                      if (iVar2 == 0) {
                        bVar1 = true;
                        y = ref_node->real[x._4_4_ * 0xf];
                        r = ref_node->real[x._4_4_ * 0xf + 1];
                        local_218 = sqrt(y * y + r * r);
                        if (local_218 - 0.5 <= 0.0) {
                          local_218 = -(local_218 - 0.5);
                        }
                        else {
                          local_218 = local_218 - 0.5;
                        }
                        h0 = local_218 * 0.198 + 0.001;
                      }
                      iVar2 = strcmp(version,"radial-1");
                      if (iVar2 == 0) {
                        bVar1 = true;
                        y = ref_node->real[x._4_4_ * 0xf] + 0.5;
                        r = ref_node->real[x._4_4_ * 0xf + 1] - 0.5;
                        atan2(r,y);
                        h0 = 0.01;
                      }
                      iVar2 = strcmp(version,"circle-1");
                      if (iVar2 == 0) {
                        bVar1 = true;
                        y = ref_node->real[x._4_4_ * 0xf] + 0.5;
                        r = ref_node->real[x._4_4_ * 0xf + 1] - 0.5;
                        local_238 = sqrt(y * y + r * r);
                        atan2(r,y);
                        if (1.0 - local_238 <= 0.0) {
                          local_238 = -(1.0 - local_238);
                        }
                        else {
                          local_238 = 1.0 - local_238;
                        }
                        h0 = local_238 * 1.5 + 0.0005;
                      }
                      dVar4 = atan2(r,y);
                      m[5] = 1.0 / (h0 * h0);
                      cos(dVar4);
                      sin(dVar4);
                      sin(dVar4);
                      cos(dVar4);
                      ref_matrix_form_m(m + 5,(REF_DBL *)&stack0xfffffffffffffec8);
                      uVar3 = ref_node_metric_set(ref_node,x._4_4_,
                                                  (REF_DBL *)&stack0xfffffffffffffec8);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                               ,0x10d,"ref_metric_twod_analytic_node",(ulong)uVar3,"set node met");
                        return uVar3;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    x._4_4_ = x._4_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_twod_analytic_node(REF_NODE ref_node,
                                                 const char *version) {
  REF_INT node;
  REF_DBL x = 0, y = 0, r, t;
  REF_DBL h_z = 1, h_t = 1, h_r = 1, h0, h, hh, hy, hx, c, k1, d0;
  REF_DBL d[12], m[6];
  REF_BOOL metric_recognized = REF_FALSE;

  each_ref_node_valid_node(ref_node, node) {
    if (strcmp(version, "larsson1") == 0) {
      REF_DBL c1 = 200.0;
      REF_DBL c2 = 200.0;
      REF_DBL m11;
      REF_DBL m22;
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      m11 =
          400.0 + c1 * sin(2.0 * ref_math_pi * x) * sin(2.0 * ref_math_pi * y);
      m22 =
          400.0 - c2 * sin(2.0 * ref_math_pi * x) * sin(2.0 * ref_math_pi * y);
      RSS(ref_node_metric_form(ref_node, node, m11, 0, 0, m22, 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "larsson2") == 0) {
      REF_DBL m11;
      REF_DBL m22;
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      m11 = pow(0.05 + 0.05 * y, -2);
      m22 = pow(0.04 + 0.12 * y, -2);
      RSS(ref_node_metric_form(ref_node, node, m11, 0, 0, m22, 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "iso01") == 0) {
      metric_recognized = REF_TRUE;
      h = 0.1;
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (h * h), 0, 0,
                               1.0 / (h * h), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "isorad") == 0) {
      metric_recognized = REF_TRUE;
      r = sqrt(pow(ref_node_xyz(ref_node, 0, node), 2) +
               pow(ref_node_xyz(ref_node, 1, node), 2) +
               pow(ref_node_xyz(ref_node, 2, node), 2));
      h = 0.1 + 0.1 * r;
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (h * h), 0, 0,
                               1.0 / (h * h), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "masabl-1") == 0) {
      metric_recognized = REF_TRUE;
      hx = 0.01 +
           0.2 * cos(ref_math_pi * (ref_node_xyz(ref_node, 0, node) - 0.5));
      c = 0.001;
      k1 = 6.0;
      hy = c * exp(k1 * ref_node_xyz(ref_node, 1, node));
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (hx * hx), 0, 0,
                               1.0 / (hy * hy), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "side") == 0) {
      metric_recognized = REF_TRUE;
      h0 = 0.1;
      h = 0.01;
      hh = h + (h0 - h) * ref_node_xyz(ref_node, 1, node);
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (0.1 * 0.1), 0, 0,
                               1.0 / (hh * hh), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "linear-0001") == 0) {
      metric_recognized = REF_TRUE;
      h0 = 0.1;
      h = 0.0001;
      hh = h + (0.1 - h) * ABS(ref_node_xyz(ref_node, 1, node) - 0.5) / 0.5;
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (0.1 * 0.1), 0, 0,
                               1.0 / (hh * hh), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "linear-01") == 0) {
      metric_recognized = REF_TRUE;
      h0 = 0.1;
      h = 0.01;
      hh = h + (0.1 - h) * ABS(ref_node_xyz(ref_node, 1, node) - 0.5) / 0.5;
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (0.1 * 0.1), 0, 0,
                               1.0 / (hh * hh), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "polar-2") == 0) {
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      r = sqrt(x * x + y * y);
      h_z = 1.0;
      h_t = 0.1;
      h0 = 0.001;
      h_r = h0 + 2 * (0.1 - h0) * ABS(r - 0.5);
      d0 = MIN(10.0 * ABS(r - 0.5), 1.0);
      h_t = 0.1 * d0 + 0.025 * (1.0 - d0);
    }
    if (strcmp(version, "radial-1") == 0) {
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node) + 0.5;
      y = ref_node_xyz(ref_node, 1, node) - 0.5;
      t = atan2(y, x);
      h_z = 1.0;
      h_t = 0.1;
      h_r = 0.01;
    }
    if (strcmp(version, "circle-1") == 0) {
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node) + 0.5;
      y = ref_node_xyz(ref_node, 1, node) - 0.5;
      r = sqrt(x * x + y * y);
      t = atan2(y, x);
      h_z = 1.0;
      h_r = 0.0005 + 1.5 * ABS(1.0 - r);
      h_t = 0.1 * r + 1.5 * ABS(1.0 - r);
    }
    t = atan2(y, x);
    ref_matrix_eig(d, 0) = 1.0 / (h_r * h_r);
    ref_matrix_eig(d, 1) = 1.0 / (h_t * h_t);
    ref_matrix_eig(d, 2) = 1.0 / (h_z * h_z);
    ref_matrix_vec(d, 0, 0) = cos(t);
    ref_matrix_vec(d, 1, 0) = sin(t);
    ref_matrix_vec(d, 2, 0) = 0.0;
    ref_matrix_vec(d, 0, 1) = -sin(t);
    ref_matrix_vec(d, 1, 1) = cos(t);
    ref_matrix_vec(d, 2, 1) = 0.0;
    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = 0.0;
    ref_matrix_vec(d, 2, 2) = 1.0;
    ref_matrix_form_m(d, m);
    RSS(ref_node_metric_set(ref_node, node, m), "set node met");
  }

  RAS(metric_recognized, "metric unknown");

  return REF_SUCCESS;
}